

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O3

uint32_t arm_lsl(status_register_t *cpsr,uint32_t data,uint32_t shift_amount)

{
  uint uVar1;
  uint uVar2;
  
  if (2 < gba_log_verbosity) {
    puts("[DEBUG] LSL shift");
  }
  if (shift_amount == 0) {
    return data;
  }
  if (shift_amount < 0x20) {
    uVar2 = data << ((byte)shift_amount & 0x1f);
    if (cpsr == (status_register_t *)0x0) goto LAB_0010ede7;
    uVar1 = cpsr->raw & 0xdfffffff | (data << ((byte)shift_amount - 1 & 0x1f)) >> 2 & 0x20000000;
  }
  else {
    if (cpsr == (status_register_t *)0x0) {
      uVar2 = 0;
      goto LAB_0010ede7;
    }
    if (shift_amount == 0x20) {
      uVar1 = cpsr->raw & 0xdfffffff | (data & 1) << 0x1d;
    }
    else {
      uVar1 = cpsr->raw & 0xdfffffff;
    }
    uVar2 = 0;
  }
  cpsr->raw = uVar1;
LAB_0010ede7:
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] result: 0x%08X\n",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

word arm_lsl(status_register_t* cpsr, word data, word shift_amount) {
    logdebug("LSL shift")
    if (shift_amount == 0) {
        return data;
    } else {
        word result;
        if (shift_amount < 32) {
            result = data << shift_amount;
            if (cpsr) {
                cpsr->C = (data << (shift_amount - 1u)) >> 31u;
            }
        }
        else {
            result = 0;
            if (cpsr) {
                // This has to be a special case since C doesn't like it when you << by >= the width of a type
                if (shift_amount == 32) {
                    cpsr->C = data & 1u;
                } else {
                    cpsr->C = 0;
                }
            }
        }
        logdebug("result: 0x%08X", result)
        return result;
    }

}